

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> * __thiscall
kj::ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry>::operator=
          (ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *this,
          ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *other)

{
  ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *other_local;
  ArrayBuilder<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Entry *)0x0;
  other->pos = (RemoveConst<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry> *)0x0;
  other->endPtr = (Entry *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }